

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_def_io.c
# Opt level: O2

char ** mk_attrib_list(char *comma_sep_attrib)

{
  char *pcVar1;
  char **ppcVar2;
  ulong uVar3;
  
  strncpy(mk_attrib_list::buf,comma_sep_attrib,0x400);
  pcVar1 = comma_whacker(mk_attrib_list::buf);
  ppcVar2 = mk_attrib_list::attrib_list;
  uVar3 = 0;
  do {
    *ppcVar2 = pcVar1;
    pcVar1 = comma_whacker((char *)0x0);
    ppcVar2 = ppcVar2 + 1;
    if (3 < uVar3) break;
    uVar3 = uVar3 + 1;
  } while (pcVar1 != (char *)0x0);
  *ppcVar2 = (char *)0x0;
  return mk_attrib_list::attrib_list;
}

Assistant:

const char **
mk_attrib_list(char *comma_sep_attrib)
{
    static char *attrib_list[MAX_N_ATTRIB+1];
    static char buf[1024];
    uint32 i;
    char *attr;

    strncpy (buf, comma_sep_attrib, 1024);

    attr = comma_whacker(buf);
    i = 0;

    do {
	attrib_list[i++] = attr;
    } while ((attr = comma_whacker(NULL)) && (i < MAX_N_ATTRIB));
    attrib_list[i] = NULL;

    if (i == MAX_N_ATTRIB+1) {
	E_WARN("Attribute list may be truncated for acoustic model, increase MAX_N_ATTRIB\n");
    }
    
    return (const char **)attrib_list;
}